

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Dch(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  Abc_Frame_t *pAbc_00;
  int iVar3;
  uint uVar4;
  Aig_Man_t *pAig;
  Gia_Man_t *pGVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  Dch_Pars_t Pars;
  Dch_Pars_t local_78;
  Abc_Frame_t *local_38;
  
  local_38 = pAbc;
  Dch_ManSetDefaultParams(&local_78);
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar1 = false;
LAB_00288552:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"WCSsptfremvh");
    pAbc_00 = local_38;
    iVar8 = globalUtilOptind;
    if (iVar3 < 0x57) {
      if (iVar3 == 0x43) {
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_00288685:
          Abc_Print(-1,pcVar6);
          goto switchD_00288574_caseD_67;
        }
        uVar4 = atoi(argv[globalUtilOptind]);
        local_78.nBTLimit = uVar4;
      }
      else {
        if (iVar3 != 0x53) {
          if (iVar3 == -1) {
            pGVar5 = local_38->pGia;
            if (pGVar5 == (Gia_Man_t *)0x0) {
              pcVar6 = "Abc_CommandAbc9Dch(): There is no AIG.\n";
            }
            else {
              if (pGVar5->nBufs == 0) {
                if (bVar1) {
                  pAig = Gia_ManToAigSimple(pGVar5);
                  if (pAbc_00->pGia->nObjs != pAig->vObjs->nSize - pAig->nDeleted) {
                    __assert_fail("Gia_ManObjNum(pAbc->pGia) == Aig_ManObjNum(pNew)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                                  ,0xa025,"int Abc_CommandAbc9Dch(Abc_Frame_t *, int, char **)");
                  }
                  Dch_ComputeEquivalences(pAig,&local_78);
                  Gia_ManReprFromAigRepr(pAig,pAbc_00->pGia);
                  Aig_ManStop(pAig);
                  pGVar5 = Gia_ManEquivReduce(pAbc_00->pGia,1,0,0,0);
                }
                else {
                  pGVar5 = Gia_ManPerformDch(pGVar5,&local_78);
                  Abc_FrameUpdateGia(pAbc_00,pGVar5);
                  if (bVar2) {
                    pGVar5 = Gia_ManEquivReduce2(pAbc_00->pGia);
                  }
                }
                Abc_FrameUpdateGia(pAbc_00,pGVar5);
                return 0;
              }
              pcVar6 = "Abc_CommandAbc9Dch(): This command does not work with barrier buffers.\n";
            }
            iVar8 = -1;
            goto LAB_0028880e;
          }
          goto switchD_00288574_caseD_67;
        }
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-S\" should be followed by an integer.\n";
          goto LAB_00288685;
        }
        uVar4 = atoi(argv[globalUtilOptind]);
        local_78.nSatVarMax = uVar4;
      }
    }
    else {
      switch(iVar3) {
      case 0x65:
        bVar1 = (bool)(bVar1 ^ 1);
        goto LAB_00288552;
      case 0x66:
        local_78.fLightSynth = local_78.fLightSynth ^ 1;
        goto LAB_00288552;
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6e:
      case 0x6f:
      case 0x71:
      case 0x75:
        goto switchD_00288574_caseD_67;
      case 0x6d:
        bVar2 = (bool)(bVar2 ^ 1);
        goto LAB_00288552;
      case 0x70:
        local_78.fPower = local_78.fPower ^ 1;
        goto LAB_00288552;
      case 0x72:
        local_78.fSkipRedSupp = local_78.fSkipRedSupp ^ 1;
        goto LAB_00288552;
      case 0x73:
        local_78.fSynthesis = local_78.fSynthesis ^ 1;
        goto LAB_00288552;
      case 0x74:
        local_78.fSimulateTfo = local_78.fSimulateTfo ^ 1;
        goto LAB_00288552;
      case 0x76:
        local_78.fVerbose = local_78.fVerbose ^ 1;
        goto LAB_00288552;
      default:
        if (iVar3 != 0x57) goto switchD_00288574_caseD_67;
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-W\" should be followed by an integer.\n";
          goto LAB_00288685;
        }
        uVar4 = atoi(argv[globalUtilOptind]);
        local_78.nWords = uVar4;
      }
    }
    globalUtilOptind = iVar8 + 1;
    if ((int)uVar4 < 0) {
switchD_00288574_caseD_67:
      Abc_Print(-2,"usage: &dch [-WCS num] [-sptfremvh]\n");
      Abc_Print(-2,"\t         computes structural choices using a new approach\n");
      Abc_Print(-2,"\t-W num : the max number of simulation words [default = %d]\n",
                (ulong)(uint)local_78.nWords);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)local_78.nBTLimit);
      Abc_Print(-2,"\t-S num : the max number of SAT variables [default = %d]\n",
                (ulong)(uint)local_78.nSatVarMax);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (local_78.fSynthesis == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle synthesizing three snapshots [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_78.fPower == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle power-aware rewriting [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_78.fSimulateTfo == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle simulation of the TFO classes [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_78.fLightSynth == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-f     : toggle using lighter logic synthesis [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_78.fSkipRedSupp == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle skipping choices with redundant support [default = %s]\n",
                pcVar6);
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-e     : toggle computing and merging equivalences [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (!bVar2) {
        pcVar6 = "no";
      }
      Abc_Print(-2,
                "\t-m     : toggle minimizing logic level after merging equivalences [default = %s]\n"
                ,pcVar6);
      if (local_78.fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar7);
      pcVar6 = "\t-h     : print the command usage\n";
      iVar8 = -2;
LAB_0028880e:
      Abc_Print(iVar8,pcVar6);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Dch( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManEquivReduce2( Gia_Man_t * p );
    Gia_Man_t * pTemp;
    Dch_Pars_t Pars, * pPars = &Pars;
    int c, fMinLevel = 0, fEquiv = 0;
    // set defaults
    Dch_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WCSsptfremvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax < 0 )
                goto usage;
            break;
        case 's':
            pPars->fSynthesis ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 't':
            pPars->fSimulateTfo ^= 1;
            break;
        case 'f':
            pPars->fLightSynth ^= 1;
            break;
        case 'r':
            pPars->fSkipRedSupp ^= 1;
            break;
        case 'e':
            fEquiv ^= 1;
            break;
        case 'm':
            fMinLevel ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dch(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dch(): This command does not work with barrier buffers.\n" );
        return 1;
    }
    if ( fEquiv )
    {
        Aig_Man_t * pNew = Gia_ManToAigSimple( pAbc->pGia );
        assert( Gia_ManObjNum(pAbc->pGia) == Aig_ManObjNum(pNew) );
        Dch_ComputeEquivalences( pNew, (Dch_Pars_t *)pPars );
        Gia_ManReprFromAigRepr( pNew, pAbc->pGia );
        Aig_ManStop( pNew );
        pTemp = Gia_ManEquivReduce( pAbc->pGia, 1, 0, 0, 0 );
    }
    else
    {
        pTemp = Gia_ManPerformDch( pAbc->pGia, pPars );
        Abc_FrameUpdateGia( pAbc, pTemp );
        if ( fMinLevel ) 
            pTemp = Gia_ManEquivReduce2( pAbc->pGia );
    }
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &dch [-WCS num] [-sptfremvh]\n" );
    Abc_Print( -2, "\t         computes structural choices using a new approach\n" );
    Abc_Print( -2, "\t-W num : the max number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-S num : the max number of SAT variables [default = %d]\n", pPars->nSatVarMax );
    Abc_Print( -2, "\t-s     : toggle synthesizing three snapshots [default = %s]\n", pPars->fSynthesis? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle power-aware rewriting [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle simulation of the TFO classes [default = %s]\n", pPars->fSimulateTfo? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle using lighter logic synthesis [default = %s]\n", pPars->fLightSynth? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle skipping choices with redundant support [default = %s]\n", pPars->fSkipRedSupp? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle computing and merging equivalences [default = %s]\n", fEquiv? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle minimizing logic level after merging equivalences [default = %s]\n", fMinLevel? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}